

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O1

PTR brynet::net::TcpService::Create(void)

{
  TcpService *this;
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  PTR PVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  peVar2 = (element_type *)operator_new(0xa0);
  (peVar2->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
  super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar2->_vptr_TcpService = (_func_int **)&PTR___Sp_counted_ptr_inplace_00147b50;
  this = (TcpService *)
         &(peVar2->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
          super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  memset(this,0,0x90);
  TcpService(this);
  (peVar2->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
  super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__TcpService_00147ba0;
  psVar1 = *(pointer *)
            ((long)&(peVar2->mIOLoopDatas).
                    super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar2;
  if ((psVar1 == (pointer)0x0) ||
     (_Var3._M_pi = extraout_RDX,
     *(int *)&(psVar1->super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi == 0)) {
    *(TcpService **)
     &(peVar2->mIOLoopDatas).
      super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
      ._M_impl.super__Vector_impl_data = this;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(peVar2->mIOLoopDatas).
                       super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
                       ._M_impl.super__Vector_impl_data + 8),&local_20);
    _Var3._M_pi = extraout_RDX_00;
  }
  in_RDI->_vptr_TcpService = (_func_int **)this;
  (in_RDI->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
  super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (in_RDI->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
  super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_20._M_pi;
  PVar4.super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  PVar4.super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (PTR)PVar4.super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpService::PTR TcpService::Create()
{
    struct make_shared_enabler : public TcpService {};
    return std::make_shared<make_shared_enabler>();
}